

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

string * __thiscall
phosg::StringReader::get_line_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,bool advance)

{
  int iVar1;
  char *pcVar2;
  out_of_range *this_00;
  ulong offset;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->length <= this->offset) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"end of string");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while (offset = __return_storage_ptr__->_M_string_length + this->offset, offset < this->length) {
    pcVar2 = pget<signed_char>(this,offset,1);
    if (*pcVar2 == '\n') break;
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,*pcVar2);
  }
  if (advance) {
    this->offset = __return_storage_ptr__->_M_string_length + this->offset + 1;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\r","");
  if (__return_storage_ptr__->_M_string_length < local_48._M_string_length) {
    bVar3 = false;
  }
  else {
    iVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(__return_storage_ptr__,
                    __return_storage_ptr__->_M_string_length - local_48._M_string_length,
                    local_48._M_string_length,&local_48);
    bVar3 = iVar1 == 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

bool StringReader::eof() const {
  return (this->offset >= this->length);
}